

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  cmOrderDirectories *pcVar1;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  string lib;
  string fname;
  string ext;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  bVar3 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar4 = true;
  if (!bVar3) {
    pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar3 = cmsys::RegularExpression::find
                          (&pcVar1->RemoveLibraryExtension,(name->_M_dataplus)._M_p), bVar3)) {
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar2 = (pcVar1->RemoveLibraryExtension).startp[1];
      local_90 = &local_80;
      if (pcVar2 == (char *)0x0) {
        local_88 = 0;
        local_80 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar2,(pcVar1->RemoveLibraryExtension).endp[1]);
      }
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar2 = (pcVar1->RemoveLibraryExtension).startp[2];
      if (pcVar2 == (char *)0x0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pcVar2,(pcVar1->RemoveLibraryExtension).endp[2]);
      }
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pbVar6 = (pcVar1->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = pbVar6 == (pcVar1->LinkExtensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar3) {
        do {
          __n = pbVar6->_M_string_length;
          if ((__n != local_48) ||
             ((__n != 0 && (iVar5 = bcmp((pbVar6->_M_dataplus)._M_p,local_50,__n), iVar5 != 0)))) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_90,local_90 + local_88);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)(pbVar6->_M_dataplus)._M_p);
            bVar4 = cmOrderDirectoriesConstraint::FileMayConflict
                              (&this->super_cmOrderDirectoriesConstraint,dir,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (bVar4) break;
          }
          pbVar6 = pbVar6 + 1;
          bVar3 = pbVar6 == (((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        } while (!bVar3);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      if (!bVar3) {
        return true;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if(this->FileMayConflict(dir, this->FileName))
    {
    return true;
    }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if(!this->OD->LinkExtensions.empty() &&
     this->OD->RemoveLibraryExtension.find(this->FileName))
    {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for(std::vector<std::string>::iterator
          i = this->OD->LinkExtensions.begin();
        i != this->OD->LinkExtensions.end(); ++i)
      {
      if(*i != ext)
        {
        std::string fname = lib;
        fname += *i;
        if(this->FileMayConflict(dir, fname))
          {
          return true;
          }
        }
      }
    }
  return false;
}